

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O2

void cdef_filter_8_1_sse4_1
               (void *dest,int dstride,uint16_t *in,int pri_strength,int sec_strength,int dir,
               int pri_damping,int sec_damping,int coeff_shift,int block_width,int block_height)

{
  char *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int iVar10;
  uint16_t uVar11;
  uint16_t uVar12;
  uint16_t uVar13;
  uint16_t uVar14;
  uint16_t uVar15;
  uint16_t uVar16;
  uint16_t uVar17;
  uint16_t uVar18;
  uint16_t uVar19;
  uint16_t uVar20;
  uint16_t uVar21;
  uint16_t uVar22;
  uint16_t uVar23;
  uint16_t uVar24;
  uint16_t uVar25;
  uint16_t uVar26;
  long lVar27;
  long lVar28;
  uint uVar29;
  long lVar30;
  long lVar31;
  bool bVar32;
  undefined1 auVar33 [16];
  ulong uVar34;
  undefined1 in_XMM2 [16];
  undefined1 auVar35 [16];
  short sVar37;
  short sVar43;
  short sVar45;
  short sVar47;
  short sVar49;
  short sVar51;
  short sVar53;
  undefined1 in_XMM5 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  short sVar55;
  short sVar56;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  short sVar64;
  short sVar65;
  undefined1 in_XMM6 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  short sVar66;
  undefined1 in_XMM7 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  short sVar76;
  undefined1 in_XMM8 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  short sVar77;
  undefined1 auVar75 [16];
  short sVar78;
  undefined4 uVar79;
  short sVar95;
  short sVar96;
  short sVar97;
  short sVar98;
  short sVar99;
  undefined1 in_XMM9 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  short sVar94;
  short sVar100;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  short sVar101;
  short sVar114;
  short sVar115;
  short sVar116;
  short sVar117;
  short sVar118;
  short sVar119;
  undefined1 in_XMM10 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  short sVar120;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 in_XMM14 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  ushort uVar36;
  ushort uVar42;
  ushort uVar44;
  ushort uVar46;
  ushort uVar48;
  ushort uVar50;
  ushort uVar52;
  ushort uVar54;
  undefined1 auVar80 [12];
  ushort uVar121;
  ushort uVar127;
  ushort uVar128;
  ushort uVar129;
  ushort uVar130;
  ushort uVar131;
  ushort uVar132;
  ushort uVar133;
  
  bVar32 = ((uint)pri_strength >> (coeff_shift & 0x1fU) & 1) != 0;
  lVar27 = (long)cdef_directions_padded[(long)dir + 2][0];
  lVar28 = (long)cdef_directions_padded[(long)dir + 2][1];
  if (block_width == 8) {
    uVar29 = pri_damping;
    if (pri_strength != 0) {
      iVar10 = 0x1f;
      if (pri_strength != 0) {
        for (; (uint)pri_strength >> iVar10 == 0; iVar10 = iVar10 + -1) {
        }
      }
      uVar29 = pri_damping - iVar10;
      if (pri_damping < iVar10) {
        uVar29 = 0;
      }
    }
    auVar33 = pshuflw(ZEXT416((uint)pri_strength),ZEXT416((uint)pri_strength),0);
    auVar35._0_4_ = auVar33._0_4_;
    auVar35._4_4_ = auVar35._0_4_;
    auVar35._8_4_ = auVar35._0_4_;
    auVar35._12_4_ = auVar35._0_4_;
    lVar30 = 0;
    auVar33 = pmovsxbw(in_XMM2,0x808080808080808);
    for (; lVar30 < block_height; lVar30 = lVar30 + 2) {
      uVar11 = *in;
      uVar12 = in[1];
      uVar13 = in[2];
      uVar14 = in[3];
      uVar15 = in[4];
      uVar16 = in[5];
      uVar17 = in[6];
      uVar18 = in[7];
      uVar19 = in[0x90];
      uVar20 = in[0x91];
      uVar21 = in[0x92];
      uVar22 = in[0x93];
      uVar23 = in[0x94];
      uVar24 = in[0x95];
      uVar25 = in[0x96];
      uVar26 = in[0x97];
      auVar38 = lddqu(in_XMM5,*(undefined1 (*) [16])(in + lVar27));
      auVar57 = lddqu(in_XMM6,*(undefined1 (*) [16])(in + lVar27 + 0x90));
      auVar71 = lddqu(in_XMM8,*(undefined1 (*) [16])(in + -lVar27));
      auVar67 = lddqu(in_XMM7,*(undefined1 (*) [16])(in + (0x90 - lVar27)));
      auVar39._0_2_ = auVar38._0_2_ - uVar11;
      auVar39._2_2_ = auVar38._2_2_ - uVar12;
      auVar39._4_2_ = auVar38._4_2_ - uVar13;
      auVar39._6_2_ = auVar38._6_2_ - uVar14;
      auVar39._8_2_ = auVar38._8_2_ - uVar15;
      auVar39._10_2_ = auVar38._10_2_ - uVar16;
      auVar39._12_2_ = auVar38._12_2_ - uVar17;
      auVar39._14_2_ = auVar38._14_2_ - uVar18;
      auVar58._0_2_ = auVar57._0_2_ - uVar19;
      auVar58._2_2_ = auVar57._2_2_ - uVar20;
      auVar58._4_2_ = auVar57._4_2_ - uVar21;
      auVar58._6_2_ = auVar57._6_2_ - uVar22;
      auVar58._8_2_ = auVar57._8_2_ - uVar23;
      auVar58._10_2_ = auVar57._10_2_ - uVar24;
      auVar58._12_2_ = auVar57._12_2_ - uVar25;
      auVar58._14_2_ = auVar57._14_2_ - uVar26;
      auVar122 = pabsw(in_XMM11,auVar39);
      auVar38 = psraw(auVar39,0xf);
      auVar134 = pabsw(in_XMM12,auVar58);
      auVar57 = psraw(auVar58,0xf);
      uVar34 = (ulong)uVar29;
      uVar36 = auVar122._0_2_;
      auVar81._0_2_ = uVar36 >> uVar34;
      uVar42 = auVar122._2_2_;
      auVar81._2_2_ = uVar42 >> uVar34;
      uVar44 = auVar122._4_2_;
      auVar81._4_2_ = uVar44 >> uVar34;
      uVar46 = auVar122._6_2_;
      auVar81._6_2_ = uVar46 >> uVar34;
      uVar48 = auVar122._8_2_;
      auVar81._8_2_ = uVar48 >> uVar34;
      uVar50 = auVar122._10_2_;
      auVar81._10_2_ = uVar50 >> uVar34;
      uVar52 = auVar122._12_2_;
      uVar54 = auVar122._14_2_;
      auVar81._12_2_ = uVar52 >> uVar34;
      auVar81._14_2_ = uVar54 >> uVar34;
      uVar121 = auVar134._0_2_;
      auVar138._0_2_ = uVar121 >> uVar34;
      uVar127 = auVar134._2_2_;
      auVar138._2_2_ = uVar127 >> uVar34;
      uVar128 = auVar134._4_2_;
      auVar138._4_2_ = uVar128 >> uVar34;
      uVar129 = auVar134._6_2_;
      auVar138._6_2_ = uVar129 >> uVar34;
      uVar130 = auVar134._8_2_;
      auVar138._8_2_ = uVar130 >> uVar34;
      uVar131 = auVar134._10_2_;
      auVar138._10_2_ = uVar131 >> uVar34;
      uVar132 = auVar134._12_2_;
      uVar133 = auVar134._14_2_;
      auVar138._12_2_ = uVar132 >> uVar34;
      auVar138._14_2_ = uVar133 >> uVar34;
      auVar102 = psubusw(auVar35,auVar81);
      auVar82 = psubusw(auVar35,auVar138);
      sVar101 = auVar102._0_2_;
      sVar114 = auVar102._2_2_;
      sVar115 = auVar102._4_2_;
      sVar116 = auVar102._6_2_;
      sVar117 = auVar102._8_2_;
      sVar118 = auVar102._10_2_;
      sVar119 = auVar102._12_2_;
      sVar120 = auVar102._14_2_;
      sVar78 = auVar82._0_2_;
      sVar94 = auVar82._2_2_;
      sVar95 = auVar82._4_2_;
      sVar96 = auVar82._6_2_;
      sVar97 = auVar82._8_2_;
      sVar98 = auVar82._10_2_;
      sVar99 = auVar82._12_2_;
      sVar100 = auVar82._14_2_;
      auVar103._0_2_ =
           (((short)uVar36 < sVar101) * uVar36 | (ushort)((short)uVar36 >= sVar101) * sVar101) +
           auVar38._0_2_;
      auVar103._2_2_ =
           (((short)uVar42 < sVar114) * uVar42 | (ushort)((short)uVar42 >= sVar114) * sVar114) +
           auVar38._2_2_;
      auVar103._4_2_ =
           (((short)uVar44 < sVar115) * uVar44 | (ushort)((short)uVar44 >= sVar115) * sVar115) +
           auVar38._4_2_;
      auVar103._6_2_ =
           (((short)uVar46 < sVar116) * uVar46 | (ushort)((short)uVar46 >= sVar116) * sVar116) +
           auVar38._6_2_;
      auVar103._8_2_ =
           (((short)uVar48 < sVar117) * uVar48 | (ushort)((short)uVar48 >= sVar117) * sVar117) +
           auVar38._8_2_;
      auVar103._10_2_ =
           (((short)uVar50 < sVar118) * uVar50 | (ushort)((short)uVar50 >= sVar118) * sVar118) +
           auVar38._10_2_;
      auVar103._12_2_ =
           (((short)uVar52 < sVar119) * uVar52 | (ushort)((short)uVar52 >= sVar119) * sVar119) +
           auVar38._12_2_;
      auVar103._14_2_ =
           (((short)uVar54 < sVar120) * uVar54 | (ushort)((short)uVar54 >= sVar120) * sVar120) +
           auVar38._14_2_;
      auVar83._0_2_ =
           (((short)uVar121 < sVar78) * uVar121 | (ushort)((short)uVar121 >= sVar78) * sVar78) +
           auVar57._0_2_;
      auVar83._2_2_ =
           (((short)uVar127 < sVar94) * uVar127 | (ushort)((short)uVar127 >= sVar94) * sVar94) +
           auVar57._2_2_;
      auVar83._4_2_ =
           (((short)uVar128 < sVar95) * uVar128 | (ushort)((short)uVar128 >= sVar95) * sVar95) +
           auVar57._4_2_;
      auVar83._6_2_ =
           (((short)uVar129 < sVar96) * uVar129 | (ushort)((short)uVar129 >= sVar96) * sVar96) +
           auVar57._6_2_;
      auVar83._8_2_ =
           (((short)uVar130 < sVar97) * uVar130 | (ushort)((short)uVar130 >= sVar97) * sVar97) +
           auVar57._8_2_;
      auVar83._10_2_ =
           (((short)uVar131 < sVar98) * uVar131 | (ushort)((short)uVar131 >= sVar98) * sVar98) +
           auVar57._10_2_;
      auVar83._12_2_ =
           (((short)uVar132 < sVar99) * uVar132 | (ushort)((short)uVar132 >= sVar99) * sVar99) +
           auVar57._12_2_;
      auVar83._14_2_ =
           (((short)uVar133 < sVar100) * uVar133 | (ushort)((short)uVar133 >= sVar100) * sVar100) +
           auVar57._14_2_;
      auVar103 = auVar103 ^ auVar38;
      auVar83 = auVar83 ^ auVar57;
      auVar72._0_2_ = auVar71._0_2_ - uVar11;
      auVar72._2_2_ = auVar71._2_2_ - uVar12;
      auVar72._4_2_ = auVar71._4_2_ - uVar13;
      auVar72._6_2_ = auVar71._6_2_ - uVar14;
      auVar72._8_2_ = auVar71._8_2_ - uVar15;
      auVar72._10_2_ = auVar71._10_2_ - uVar16;
      auVar72._12_2_ = auVar71._12_2_ - uVar17;
      auVar72._14_2_ = auVar71._14_2_ - uVar18;
      auVar68._0_2_ = auVar67._0_2_ - uVar19;
      auVar68._2_2_ = auVar67._2_2_ - uVar20;
      auVar68._4_2_ = auVar67._4_2_ - uVar21;
      auVar68._6_2_ = auVar67._6_2_ - uVar22;
      auVar68._8_2_ = auVar67._8_2_ - uVar23;
      auVar68._10_2_ = auVar67._10_2_ - uVar24;
      auVar68._12_2_ = auVar67._12_2_ - uVar25;
      auVar68._14_2_ = auVar67._14_2_ - uVar26;
      auVar38 = pabsw(auVar122,auVar72);
      auVar71 = psraw(auVar72,0xf);
      uVar34 = (ulong)uVar29;
      uVar36 = auVar38._0_2_;
      auVar40._0_2_ = uVar36 >> uVar34;
      uVar42 = auVar38._2_2_;
      auVar40._2_2_ = uVar42 >> uVar34;
      uVar44 = auVar38._4_2_;
      auVar40._4_2_ = uVar44 >> uVar34;
      uVar46 = auVar38._6_2_;
      auVar40._6_2_ = uVar46 >> uVar34;
      uVar48 = auVar38._8_2_;
      auVar40._8_2_ = uVar48 >> uVar34;
      uVar50 = auVar38._10_2_;
      auVar40._10_2_ = uVar50 >> uVar34;
      uVar52 = auVar38._12_2_;
      uVar54 = auVar38._14_2_;
      auVar40._12_2_ = uVar52 >> uVar34;
      auVar40._14_2_ = uVar54 >> uVar34;
      auVar38 = pabsw(auVar134,auVar68);
      uVar121 = auVar38._0_2_;
      auVar139._0_2_ = uVar121 >> uVar34;
      uVar127 = auVar38._2_2_;
      auVar139._2_2_ = uVar127 >> uVar34;
      uVar128 = auVar38._4_2_;
      auVar139._4_2_ = uVar128 >> uVar34;
      uVar129 = auVar38._6_2_;
      auVar139._6_2_ = uVar129 >> uVar34;
      uVar130 = auVar38._8_2_;
      auVar139._8_2_ = uVar130 >> uVar34;
      uVar131 = auVar38._10_2_;
      auVar139._10_2_ = uVar131 >> uVar34;
      uVar132 = auVar38._12_2_;
      uVar133 = auVar38._14_2_;
      auVar139._12_2_ = uVar132 >> uVar34;
      auVar139._14_2_ = uVar133 >> uVar34;
      auVar67 = psraw(auVar68,0xf);
      auVar57 = psubusw(auVar35,auVar40);
      auVar38 = psubusw(auVar35,auVar139);
      sVar101 = auVar57._0_2_;
      sVar114 = auVar57._2_2_;
      sVar115 = auVar57._4_2_;
      sVar116 = auVar57._6_2_;
      sVar117 = auVar57._8_2_;
      sVar118 = auVar57._10_2_;
      sVar119 = auVar57._12_2_;
      sVar120 = auVar57._14_2_;
      sVar78 = auVar38._0_2_;
      sVar94 = auVar38._2_2_;
      sVar95 = auVar38._4_2_;
      sVar96 = auVar38._6_2_;
      sVar97 = auVar38._8_2_;
      sVar98 = auVar38._10_2_;
      sVar99 = auVar38._12_2_;
      sVar100 = auVar38._14_2_;
      auVar59._0_2_ =
           (((short)uVar36 < sVar101) * uVar36 | (ushort)((short)uVar36 >= sVar101) * sVar101) +
           auVar71._0_2_;
      auVar59._2_2_ =
           (((short)uVar42 < sVar114) * uVar42 | (ushort)((short)uVar42 >= sVar114) * sVar114) +
           auVar71._2_2_;
      auVar59._4_2_ =
           (((short)uVar44 < sVar115) * uVar44 | (ushort)((short)uVar44 >= sVar115) * sVar115) +
           auVar71._4_2_;
      auVar59._6_2_ =
           (((short)uVar46 < sVar116) * uVar46 | (ushort)((short)uVar46 >= sVar116) * sVar116) +
           auVar71._6_2_;
      auVar59._8_2_ =
           (((short)uVar48 < sVar117) * uVar48 | (ushort)((short)uVar48 >= sVar117) * sVar117) +
           auVar71._8_2_;
      auVar59._10_2_ =
           (((short)uVar50 < sVar118) * uVar50 | (ushort)((short)uVar50 >= sVar118) * sVar118) +
           auVar71._10_2_;
      auVar59._12_2_ =
           (((short)uVar52 < sVar119) * uVar52 | (ushort)((short)uVar52 >= sVar119) * sVar119) +
           auVar71._12_2_;
      auVar59._14_2_ =
           (((short)uVar54 < sVar120) * uVar54 | (ushort)((short)uVar54 >= sVar120) * sVar120) +
           auVar71._14_2_;
      auVar41._0_2_ =
           (((short)uVar121 < sVar78) * uVar121 | (ushort)((short)uVar121 >= sVar78) * sVar78) +
           auVar67._0_2_;
      auVar41._2_2_ =
           (((short)uVar127 < sVar94) * uVar127 | (ushort)((short)uVar127 >= sVar94) * sVar94) +
           auVar67._2_2_;
      auVar41._4_2_ =
           (((short)uVar128 < sVar95) * uVar128 | (ushort)((short)uVar128 >= sVar95) * sVar95) +
           auVar67._4_2_;
      auVar41._6_2_ =
           (((short)uVar129 < sVar96) * uVar129 | (ushort)((short)uVar129 >= sVar96) * sVar96) +
           auVar67._6_2_;
      auVar41._8_2_ =
           (((short)uVar130 < sVar97) * uVar130 | (ushort)((short)uVar130 >= sVar97) * sVar97) +
           auVar67._8_2_;
      auVar41._10_2_ =
           (((short)uVar131 < sVar98) * uVar131 | (ushort)((short)uVar131 >= sVar98) * sVar98) +
           auVar67._10_2_;
      auVar41._12_2_ =
           (((short)uVar132 < sVar99) * uVar132 | (ushort)((short)uVar132 >= sVar99) * sVar99) +
           auVar67._12_2_;
      auVar41._14_2_ =
           (((short)uVar133 < sVar100) * uVar133 | (ushort)((short)uVar133 >= sVar100) * sVar100) +
           auVar67._14_2_;
      auVar59 = auVar59 ^ auVar71;
      auVar41 = auVar41 ^ auVar67;
      auVar38 = pshuflw(ZEXT416((uint)cdef_pri_taps[bVar32][0]),
                        ZEXT416((uint)cdef_pri_taps[bVar32][0]),0);
      auVar69._0_4_ = auVar38._0_4_;
      auVar69._4_4_ = auVar69._0_4_;
      auVar69._8_4_ = auVar69._0_4_;
      auVar69._12_4_ = auVar69._0_4_;
      sVar78 = auVar38._0_2_;
      sVar95 = auVar38._2_2_;
      auVar67 = lddqu(auVar83,*(undefined1 (*) [16])(in + lVar28));
      auVar82 = lddqu(auVar103,*(undefined1 (*) [16])(in + lVar28 + 0x90));
      auVar57 = lddqu(auVar71,*(undefined1 (*) [16])(in + -lVar28));
      auVar38 = lddqu(auVar69,*(undefined1 (*) [16])(in + (0x90 - lVar28)));
      auVar84._0_2_ = auVar67._0_2_ - uVar11;
      auVar84._2_2_ = auVar67._2_2_ - uVar12;
      auVar84._4_2_ = auVar67._4_2_ - uVar13;
      auVar84._6_2_ = auVar67._6_2_ - uVar14;
      auVar84._8_2_ = auVar67._8_2_ - uVar15;
      auVar84._10_2_ = auVar67._10_2_ - uVar16;
      auVar84._12_2_ = auVar67._12_2_ - uVar17;
      auVar84._14_2_ = auVar67._14_2_ - uVar18;
      auVar104._0_2_ = auVar82._0_2_ - uVar19;
      auVar104._2_2_ = auVar82._2_2_ - uVar20;
      auVar104._4_2_ = auVar82._4_2_ - uVar21;
      auVar104._6_2_ = auVar82._6_2_ - uVar22;
      auVar104._8_2_ = auVar82._8_2_ - uVar23;
      auVar104._10_2_ = auVar82._10_2_ - uVar24;
      auVar104._12_2_ = auVar82._12_2_ - uVar25;
      auVar104._14_2_ = auVar82._14_2_ - uVar26;
      auVar122 = pabsw(auVar139,auVar84);
      auVar67 = psraw(auVar84,0xf);
      auVar134 = pabsw(in_XMM14,auVar104);
      auVar71 = psraw(auVar104,0xf);
      uVar36 = auVar122._0_2_;
      auVar123._0_2_ = uVar36 >> uVar34;
      uVar42 = auVar122._2_2_;
      auVar123._2_2_ = uVar42 >> uVar34;
      uVar44 = auVar122._4_2_;
      auVar123._4_2_ = uVar44 >> uVar34;
      uVar46 = auVar122._6_2_;
      auVar123._6_2_ = uVar46 >> uVar34;
      uVar48 = auVar122._8_2_;
      auVar123._8_2_ = uVar48 >> uVar34;
      uVar50 = auVar122._10_2_;
      auVar123._10_2_ = uVar50 >> uVar34;
      uVar52 = auVar122._12_2_;
      uVar54 = auVar122._14_2_;
      auVar123._12_2_ = uVar52 >> uVar34;
      auVar123._14_2_ = uVar54 >> uVar34;
      uVar121 = auVar134._0_2_;
      auVar142._0_2_ = uVar121 >> uVar34;
      uVar127 = auVar134._2_2_;
      auVar142._2_2_ = uVar127 >> uVar34;
      uVar128 = auVar134._4_2_;
      auVar142._4_2_ = uVar128 >> uVar34;
      uVar129 = auVar134._6_2_;
      auVar142._6_2_ = uVar129 >> uVar34;
      uVar130 = auVar134._8_2_;
      auVar142._8_2_ = uVar130 >> uVar34;
      uVar131 = auVar134._10_2_;
      auVar142._10_2_ = uVar131 >> uVar34;
      uVar132 = auVar134._12_2_;
      uVar133 = auVar134._14_2_;
      auVar142._12_2_ = uVar132 >> uVar34;
      auVar142._14_2_ = uVar133 >> uVar34;
      auVar102 = psubusw(auVar35,auVar123);
      auVar82 = psubusw(auVar35,auVar142);
      sVar115 = auVar102._0_2_;
      sVar116 = auVar102._2_2_;
      sVar117 = auVar102._4_2_;
      sVar118 = auVar102._6_2_;
      sVar119 = auVar102._8_2_;
      sVar120 = auVar102._10_2_;
      sVar37 = auVar102._12_2_;
      sVar43 = auVar102._14_2_;
      sVar94 = auVar82._0_2_;
      sVar96 = auVar82._2_2_;
      sVar97 = auVar82._4_2_;
      sVar98 = auVar82._6_2_;
      sVar99 = auVar82._8_2_;
      sVar100 = auVar82._10_2_;
      sVar101 = auVar82._12_2_;
      sVar114 = auVar82._14_2_;
      auVar135._0_2_ =
           (((short)uVar36 < sVar115) * uVar36 | (ushort)((short)uVar36 >= sVar115) * sVar115) +
           auVar67._0_2_;
      auVar135._2_2_ =
           (((short)uVar42 < sVar116) * uVar42 | (ushort)((short)uVar42 >= sVar116) * sVar116) +
           auVar67._2_2_;
      auVar135._4_2_ =
           (((short)uVar44 < sVar117) * uVar44 | (ushort)((short)uVar44 >= sVar117) * sVar117) +
           auVar67._4_2_;
      auVar135._6_2_ =
           (((short)uVar46 < sVar118) * uVar46 | (ushort)((short)uVar46 >= sVar118) * sVar118) +
           auVar67._6_2_;
      auVar135._8_2_ =
           (((short)uVar48 < sVar119) * uVar48 | (ushort)((short)uVar48 >= sVar119) * sVar119) +
           auVar67._8_2_;
      auVar135._10_2_ =
           (((short)uVar50 < sVar120) * uVar50 | (ushort)((short)uVar50 >= sVar120) * sVar120) +
           auVar67._10_2_;
      auVar135._12_2_ =
           (((short)uVar52 < sVar37) * uVar52 | (ushort)((short)uVar52 >= sVar37) * sVar37) +
           auVar67._12_2_;
      auVar135._14_2_ =
           (((short)uVar54 < sVar43) * uVar54 | (ushort)((short)uVar54 >= sVar43) * sVar43) +
           auVar67._14_2_;
      auVar124._0_2_ =
           (((short)uVar121 < sVar94) * uVar121 | (ushort)((short)uVar121 >= sVar94) * sVar94) +
           auVar71._0_2_;
      auVar124._2_2_ =
           (((short)uVar127 < sVar96) * uVar127 | (ushort)((short)uVar127 >= sVar96) * sVar96) +
           auVar71._2_2_;
      auVar124._4_2_ =
           (((short)uVar128 < sVar97) * uVar128 | (ushort)((short)uVar128 >= sVar97) * sVar97) +
           auVar71._4_2_;
      auVar124._6_2_ =
           (((short)uVar129 < sVar98) * uVar129 | (ushort)((short)uVar129 >= sVar98) * sVar98) +
           auVar71._6_2_;
      auVar124._8_2_ =
           (((short)uVar130 < sVar99) * uVar130 | (ushort)((short)uVar130 >= sVar99) * sVar99) +
           auVar71._8_2_;
      auVar124._10_2_ =
           (((short)uVar131 < sVar100) * uVar131 | (ushort)((short)uVar131 >= sVar100) * sVar100) +
           auVar71._10_2_;
      auVar124._12_2_ =
           (((short)uVar132 < sVar101) * uVar132 | (ushort)((short)uVar132 >= sVar101) * sVar101) +
           auVar71._12_2_;
      auVar124._14_2_ =
           (((short)uVar133 < sVar114) * uVar133 | (ushort)((short)uVar133 >= sVar114) * sVar114) +
           auVar71._14_2_;
      in_XMM12 = auVar135 ^ auVar67;
      in_XMM11 = auVar124 ^ auVar71;
      auVar73._0_2_ = auVar57._0_2_ - uVar11;
      auVar73._2_2_ = auVar57._2_2_ - uVar12;
      auVar73._4_2_ = auVar57._4_2_ - uVar13;
      auVar73._6_2_ = auVar57._6_2_ - uVar14;
      auVar73._8_2_ = auVar57._8_2_ - uVar15;
      auVar73._10_2_ = auVar57._10_2_ - uVar16;
      auVar73._12_2_ = auVar57._12_2_ - uVar17;
      auVar73._14_2_ = auVar57._14_2_ - uVar18;
      auVar70._0_2_ = auVar38._0_2_ - uVar19;
      auVar70._2_2_ = auVar38._2_2_ - uVar20;
      auVar70._4_2_ = auVar38._4_2_ - uVar21;
      auVar70._6_2_ = auVar38._6_2_ - uVar22;
      auVar70._8_2_ = auVar38._8_2_ - uVar23;
      auVar70._10_2_ = auVar38._10_2_ - uVar24;
      auVar70._12_2_ = auVar38._12_2_ - uVar25;
      auVar70._14_2_ = auVar38._14_2_ - uVar26;
      auVar38 = pabsw(auVar122,auVar73);
      in_XMM8 = psraw(auVar73,0xf);
      in_XMM14 = pabsw(auVar134,auVar70);
      uVar34 = (ulong)uVar29;
      uVar36 = auVar38._0_2_;
      auVar105._0_2_ = uVar36 >> uVar34;
      uVar42 = auVar38._2_2_;
      auVar105._2_2_ = uVar42 >> uVar34;
      uVar44 = auVar38._4_2_;
      auVar105._4_2_ = uVar44 >> uVar34;
      uVar46 = auVar38._6_2_;
      auVar105._6_2_ = uVar46 >> uVar34;
      uVar48 = auVar38._8_2_;
      auVar105._8_2_ = uVar48 >> uVar34;
      uVar50 = auVar38._10_2_;
      auVar105._10_2_ = uVar50 >> uVar34;
      uVar52 = auVar38._12_2_;
      uVar54 = auVar38._14_2_;
      auVar105._12_2_ = uVar52 >> uVar34;
      auVar105._14_2_ = uVar54 >> uVar34;
      auVar38 = psraw(auVar70,0xf);
      uVar121 = in_XMM14._0_2_;
      auVar143._0_2_ = uVar121 >> uVar34;
      uVar127 = in_XMM14._2_2_;
      auVar143._2_2_ = uVar127 >> uVar34;
      uVar128 = in_XMM14._4_2_;
      auVar143._4_2_ = uVar128 >> uVar34;
      uVar129 = in_XMM14._6_2_;
      auVar143._6_2_ = uVar129 >> uVar34;
      uVar130 = in_XMM14._8_2_;
      auVar143._8_2_ = uVar130 >> uVar34;
      uVar131 = in_XMM14._10_2_;
      auVar143._10_2_ = uVar131 >> uVar34;
      uVar132 = in_XMM14._12_2_;
      uVar133 = in_XMM14._14_2_;
      auVar143._12_2_ = uVar132 >> uVar34;
      auVar143._14_2_ = uVar133 >> uVar34;
      auVar57 = psubusw(auVar35,auVar105);
      auVar67 = psubusw(auVar35,auVar143);
      sVar94 = auVar57._0_2_;
      sVar96 = auVar57._2_2_;
      sVar97 = auVar57._4_2_;
      sVar98 = auVar57._6_2_;
      sVar99 = auVar57._8_2_;
      sVar100 = auVar57._10_2_;
      sVar101 = auVar57._12_2_;
      sVar114 = auVar57._14_2_;
      sVar115 = auVar67._0_2_;
      sVar116 = auVar67._2_2_;
      sVar117 = auVar67._4_2_;
      sVar118 = auVar67._6_2_;
      sVar119 = auVar67._8_2_;
      sVar120 = auVar67._10_2_;
      sVar37 = auVar67._12_2_;
      sVar43 = auVar67._14_2_;
      auVar85._0_2_ =
           (((short)uVar36 < sVar94) * uVar36 | (ushort)((short)uVar36 >= sVar94) * sVar94) +
           in_XMM8._0_2_;
      auVar85._2_2_ =
           (((short)uVar42 < sVar96) * uVar42 | (ushort)((short)uVar42 >= sVar96) * sVar96) +
           in_XMM8._2_2_;
      auVar85._4_2_ =
           (((short)uVar44 < sVar97) * uVar44 | (ushort)((short)uVar44 >= sVar97) * sVar97) +
           in_XMM8._4_2_;
      auVar85._6_2_ =
           (((short)uVar46 < sVar98) * uVar46 | (ushort)((short)uVar46 >= sVar98) * sVar98) +
           in_XMM8._6_2_;
      auVar85._8_2_ =
           (((short)uVar48 < sVar99) * uVar48 | (ushort)((short)uVar48 >= sVar99) * sVar99) +
           in_XMM8._8_2_;
      auVar85._10_2_ =
           (((short)uVar50 < sVar100) * uVar50 | (ushort)((short)uVar50 >= sVar100) * sVar100) +
           in_XMM8._10_2_;
      auVar85._12_2_ =
           (((short)uVar52 < sVar101) * uVar52 | (ushort)((short)uVar52 >= sVar101) * sVar101) +
           in_XMM8._12_2_;
      auVar85._14_2_ =
           (((short)uVar54 < sVar114) * uVar54 | (ushort)((short)uVar54 >= sVar114) * sVar114) +
           in_XMM8._14_2_;
      auVar106._0_2_ =
           (((short)uVar121 < sVar115) * uVar121 | (ushort)((short)uVar121 >= sVar115) * sVar115) +
           auVar38._0_2_;
      auVar106._2_2_ =
           (((short)uVar127 < sVar116) * uVar127 | (ushort)((short)uVar127 >= sVar116) * sVar116) +
           auVar38._2_2_;
      auVar106._4_2_ =
           (((short)uVar128 < sVar117) * uVar128 | (ushort)((short)uVar128 >= sVar117) * sVar117) +
           auVar38._4_2_;
      auVar106._6_2_ =
           (((short)uVar129 < sVar118) * uVar129 | (ushort)((short)uVar129 >= sVar118) * sVar118) +
           auVar38._6_2_;
      auVar106._8_2_ =
           (((short)uVar130 < sVar119) * uVar130 | (ushort)((short)uVar130 >= sVar119) * sVar119) +
           auVar38._8_2_;
      auVar106._10_2_ =
           (((short)uVar131 < sVar120) * uVar131 | (ushort)((short)uVar131 >= sVar120) * sVar120) +
           auVar38._10_2_;
      auVar106._12_2_ =
           (((short)uVar132 < sVar37) * uVar132 | (ushort)((short)uVar132 >= sVar37) * sVar37) +
           auVar38._12_2_;
      auVar106._14_2_ =
           (((short)uVar133 < sVar43) * uVar133 | (ushort)((short)uVar133 >= sVar43) * sVar43) +
           auVar38._14_2_;
      auVar85 = auVar85 ^ in_XMM8;
      auVar106 = auVar106 ^ auVar38;
      auVar38 = pshuflw(ZEXT416((uint)cdef_pri_taps[bVar32][1]),
                        ZEXT416((uint)cdef_pri_taps[bVar32][1]),0);
      in_XMM7._0_4_ = auVar38._0_4_;
      in_XMM7._4_4_ = in_XMM7._0_4_;
      in_XMM7._8_4_ = in_XMM7._0_4_;
      in_XMM7._12_4_ = in_XMM7._0_4_;
      sVar94 = auVar38._0_2_;
      sVar96 = auVar38._2_2_;
      auVar86._0_2_ =
           (auVar85._0_2_ + in_XMM12._0_2_) * sVar94 + (auVar59._0_2_ + auVar103._0_2_) * sVar78;
      auVar86._2_2_ =
           (auVar85._2_2_ + in_XMM12._2_2_) * sVar96 + (auVar59._2_2_ + auVar103._2_2_) * sVar95;
      auVar86._4_2_ =
           (auVar85._4_2_ + in_XMM12._4_2_) * sVar94 + (auVar59._4_2_ + auVar103._4_2_) * sVar78;
      auVar86._6_2_ =
           (auVar85._6_2_ + in_XMM12._6_2_) * sVar96 + (auVar59._6_2_ + auVar103._6_2_) * sVar95;
      auVar86._8_2_ =
           (auVar85._8_2_ + in_XMM12._8_2_) * sVar94 + (auVar59._8_2_ + auVar103._8_2_) * sVar78;
      auVar86._10_2_ =
           (auVar85._10_2_ + in_XMM12._10_2_) * sVar96 + (auVar59._10_2_ + auVar103._10_2_) * sVar95
      ;
      auVar86._12_2_ =
           (auVar85._12_2_ + in_XMM12._12_2_) * sVar94 + (auVar59._12_2_ + auVar103._12_2_) * sVar78
      ;
      auVar86._14_2_ =
           (auVar85._14_2_ + in_XMM12._14_2_) * sVar96 + (auVar59._14_2_ + auVar103._14_2_) * sVar95
      ;
      auVar107._0_2_ =
           (auVar106._0_2_ + in_XMM11._0_2_) * sVar94 + (auVar41._0_2_ + auVar83._0_2_) * sVar78;
      auVar107._2_2_ =
           (auVar106._2_2_ + in_XMM11._2_2_) * sVar96 + (auVar41._2_2_ + auVar83._2_2_) * sVar95;
      auVar107._4_2_ =
           (auVar106._4_2_ + in_XMM11._4_2_) * sVar94 + (auVar41._4_2_ + auVar83._4_2_) * sVar78;
      auVar107._6_2_ =
           (auVar106._6_2_ + in_XMM11._6_2_) * sVar96 + (auVar41._6_2_ + auVar83._6_2_) * sVar95;
      auVar107._8_2_ =
           (auVar106._8_2_ + in_XMM11._8_2_) * sVar94 + (auVar41._8_2_ + auVar83._8_2_) * sVar78;
      auVar107._10_2_ =
           (auVar106._10_2_ + in_XMM11._10_2_) * sVar96 + (auVar41._10_2_ + auVar83._10_2_) * sVar95
      ;
      auVar107._12_2_ =
           (auVar106._12_2_ + in_XMM11._12_2_) * sVar94 + (auVar41._12_2_ + auVar83._12_2_) * sVar78
      ;
      auVar107._14_2_ =
           (auVar106._14_2_ + in_XMM11._14_2_) * sVar96 + (auVar41._14_2_ + auVar83._14_2_) * sVar95
      ;
      in_XMM5 = psraw(auVar86,0xf);
      in_XMM6 = psraw(auVar107,0xf);
      auVar87._0_2_ = auVar86._0_2_ + auVar33._0_2_ + in_XMM5._0_2_;
      auVar87._2_2_ = auVar86._2_2_ + auVar33._2_2_ + in_XMM5._2_2_;
      auVar87._4_2_ = auVar86._4_2_ + auVar33._4_2_ + in_XMM5._4_2_;
      auVar87._6_2_ = auVar86._6_2_ + auVar33._6_2_ + in_XMM5._6_2_;
      auVar87._8_2_ = auVar86._8_2_ + auVar33._8_2_ + in_XMM5._8_2_;
      auVar87._10_2_ = auVar86._10_2_ + auVar33._10_2_ + in_XMM5._10_2_;
      auVar87._12_2_ = auVar86._12_2_ + auVar33._12_2_ + in_XMM5._12_2_;
      auVar87._14_2_ = auVar86._14_2_ + auVar33._14_2_ + in_XMM5._14_2_;
      auVar108._0_2_ = auVar107._0_2_ + auVar33._0_2_ + in_XMM6._0_2_;
      auVar108._2_2_ = auVar107._2_2_ + auVar33._2_2_ + in_XMM6._2_2_;
      auVar108._4_2_ = auVar107._4_2_ + auVar33._4_2_ + in_XMM6._4_2_;
      auVar108._6_2_ = auVar107._6_2_ + auVar33._6_2_ + in_XMM6._6_2_;
      auVar108._8_2_ = auVar107._8_2_ + auVar33._8_2_ + in_XMM6._8_2_;
      auVar108._10_2_ = auVar107._10_2_ + auVar33._10_2_ + in_XMM6._10_2_;
      auVar108._12_2_ = auVar107._12_2_ + auVar33._12_2_ + in_XMM6._12_2_;
      auVar108._14_2_ = auVar107._14_2_ + auVar33._14_2_ + in_XMM6._14_2_;
      auVar38 = psraw(auVar87,4);
      auVar57 = psraw(auVar108,4);
      sVar78 = auVar38._0_2_ + uVar11;
      sVar94 = auVar38._2_2_ + uVar12;
      sVar95 = auVar38._4_2_ + uVar13;
      sVar96 = auVar38._6_2_ + uVar14;
      sVar97 = auVar38._8_2_ + uVar15;
      sVar98 = auVar38._10_2_ + uVar16;
      sVar99 = auVar38._12_2_ + uVar17;
      sVar100 = auVar38._14_2_ + uVar18;
      sVar101 = auVar57._0_2_ + uVar19;
      sVar114 = auVar57._2_2_ + uVar20;
      sVar115 = auVar57._4_2_ + uVar21;
      sVar116 = auVar57._6_2_ + uVar22;
      sVar117 = auVar57._8_2_ + uVar23;
      sVar118 = auVar57._10_2_ + uVar24;
      sVar119 = auVar57._12_2_ + uVar25;
      sVar120 = auVar57._14_2_ + uVar26;
      *(char *)((long)dest + 8) = (0 < sVar78) * (sVar78 < 0x100) * (char)sVar78 - (0xff < sVar78);
      *(char *)((long)dest + 9) = (0 < sVar94) * (sVar94 < 0x100) * (char)sVar94 - (0xff < sVar94);
      *(char *)((long)dest + 10) = (0 < sVar95) * (sVar95 < 0x100) * (char)sVar95 - (0xff < sVar95);
      *(char *)((long)dest + 0xb) = (0 < sVar96) * (sVar96 < 0x100) * (char)sVar96 - (0xff < sVar96)
      ;
      *(char *)((long)dest + 0xc) = (0 < sVar97) * (sVar97 < 0x100) * (char)sVar97 - (0xff < sVar97)
      ;
      *(char *)((long)dest + 0xd) = (0 < sVar98) * (sVar98 < 0x100) * (char)sVar98 - (0xff < sVar98)
      ;
      *(char *)((long)dest + 0xe) = (0 < sVar99) * (sVar99 < 0x100) * (char)sVar99 - (0xff < sVar99)
      ;
      *(char *)((long)dest + 0xf) =
           (0 < sVar100) * (sVar100 < 0x100) * (char)sVar100 - (0xff < sVar100);
      pcVar1 = (char *)((long)dest + (long)dstride);
      *pcVar1 = (0 < sVar101) * (sVar101 < 0x100) * (char)sVar101 - (0xff < sVar101);
      pcVar1[1] = (0 < sVar114) * (sVar114 < 0x100) * (char)sVar114 - (0xff < sVar114);
      pcVar1[2] = (0 < sVar115) * (sVar115 < 0x100) * (char)sVar115 - (0xff < sVar115);
      pcVar1[3] = (0 < sVar116) * (sVar116 < 0x100) * (char)sVar116 - (0xff < sVar116);
      pcVar1[4] = (0 < sVar117) * (sVar117 < 0x100) * (char)sVar117 - (0xff < sVar117);
      pcVar1[5] = (0 < sVar118) * (sVar118 < 0x100) * (char)sVar118 - (0xff < sVar118);
      pcVar1[6] = (0 < sVar119) * (sVar119 < 0x100) * (char)sVar119 - (0xff < sVar119);
      pcVar1[7] = (0 < sVar120) * (sVar120 < 0x100) * (char)sVar120 - (0xff < sVar120);
      dest = (void *)((long)dest + (long)dstride * 2);
      in = in + 0x120;
    }
  }
  else {
    uVar29 = pri_damping;
    if (pri_strength != 0) {
      iVar10 = 0x1f;
      if (pri_strength != 0) {
        for (; (uint)pri_strength >> iVar10 == 0; iVar10 = iVar10 + -1) {
        }
      }
      uVar29 = pri_damping - iVar10;
      if (pri_damping < iVar10) {
        uVar29 = 0;
      }
    }
    auVar33 = pshuflw(ZEXT416((uint)pri_strength),ZEXT416((uint)pri_strength),0);
    auVar33._4_4_ = auVar33._0_4_;
    auVar33._8_4_ = auVar33._0_4_;
    auVar33._12_4_ = auVar33._0_4_;
    lVar30 = (long)dstride;
    lVar31 = 0;
    auVar35 = pmovsxbw(in_XMM2,0x808080808080808);
    for (; lVar31 < block_height; lVar31 = lVar31 + 4) {
      uVar2 = *(undefined8 *)in;
      uVar3 = *(undefined8 *)(in + 0x90);
      uVar4 = *(undefined8 *)(in + 0x120);
      uVar5 = *(undefined8 *)(in + 0x1b0);
      uVar6 = *(undefined8 *)(in + lVar27);
      uVar7 = *(undefined8 *)(in + lVar27 + 0x90);
      uVar8 = *(undefined8 *)(in + lVar27 + 0x120);
      uVar9 = *(undefined8 *)(in + lVar27 + 0x1b0);
      sVar78 = (short)uVar3;
      auVar38._0_2_ = (short)uVar7 - sVar78;
      sVar94 = (short)((ulong)uVar3 >> 0x10);
      auVar38._2_2_ = (short)((ulong)uVar7 >> 0x10) - sVar94;
      sVar95 = (short)((ulong)uVar3 >> 0x20);
      auVar38._4_2_ = (short)((ulong)uVar7 >> 0x20) - sVar95;
      sVar96 = (short)((ulong)uVar3 >> 0x30);
      auVar38._6_2_ = (short)((ulong)uVar7 >> 0x30) - sVar96;
      sVar97 = (short)uVar2;
      auVar38._8_2_ = (short)uVar6 - sVar97;
      sVar98 = (short)((ulong)uVar2 >> 0x10);
      auVar38._10_2_ = (short)((ulong)uVar6 >> 0x10) - sVar98;
      sVar99 = (short)((ulong)uVar2 >> 0x20);
      auVar38._12_2_ = (short)((ulong)uVar6 >> 0x20) - sVar99;
      sVar100 = (short)((ulong)uVar2 >> 0x30);
      auVar38._14_2_ = (short)((ulong)uVar6 >> 0x30) - sVar100;
      sVar101 = (short)uVar5;
      auVar71._0_2_ = (short)uVar9 - sVar101;
      sVar114 = (short)((ulong)uVar5 >> 0x10);
      auVar71._2_2_ = (short)((ulong)uVar9 >> 0x10) - sVar114;
      sVar115 = (short)((ulong)uVar5 >> 0x20);
      auVar71._4_2_ = (short)((ulong)uVar9 >> 0x20) - sVar115;
      sVar116 = (short)((ulong)uVar5 >> 0x30);
      auVar71._6_2_ = (short)((ulong)uVar9 >> 0x30) - sVar116;
      sVar117 = (short)uVar4;
      auVar71._8_2_ = (short)uVar8 - sVar117;
      sVar118 = (short)((ulong)uVar4 >> 0x10);
      auVar71._10_2_ = (short)((ulong)uVar8 >> 0x10) - sVar118;
      sVar119 = (short)((ulong)uVar4 >> 0x20);
      auVar71._12_2_ = (short)((ulong)uVar8 >> 0x20) - sVar119;
      sVar120 = (short)((ulong)uVar4 >> 0x30);
      auVar71._14_2_ = (short)((ulong)uVar8 >> 0x30) - sVar120;
      auVar57 = pabsw(in_XMM9,auVar38);
      auVar38 = psraw(auVar38,0xf);
      uVar34 = (ulong)uVar29;
      uVar36 = auVar57._0_2_;
      auVar102._0_2_ = uVar36 >> uVar34;
      uVar42 = auVar57._2_2_;
      auVar102._2_2_ = uVar42 >> uVar34;
      uVar44 = auVar57._4_2_;
      auVar102._4_2_ = uVar44 >> uVar34;
      uVar46 = auVar57._6_2_;
      auVar102._6_2_ = uVar46 >> uVar34;
      uVar48 = auVar57._8_2_;
      auVar102._8_2_ = uVar48 >> uVar34;
      uVar50 = auVar57._10_2_;
      auVar102._10_2_ = uVar50 >> uVar34;
      uVar52 = auVar57._12_2_;
      uVar54 = auVar57._14_2_;
      auVar102._12_2_ = uVar52 >> uVar34;
      auVar102._14_2_ = uVar54 >> uVar34;
      auVar57 = pabsw(in_XMM10,auVar71);
      uVar121 = auVar57._0_2_;
      auVar125._0_2_ = uVar121 >> uVar34;
      uVar127 = auVar57._2_2_;
      auVar125._2_2_ = uVar127 >> uVar34;
      uVar128 = auVar57._4_2_;
      auVar125._4_2_ = uVar128 >> uVar34;
      uVar129 = auVar57._6_2_;
      auVar125._6_2_ = uVar129 >> uVar34;
      uVar130 = auVar57._8_2_;
      auVar125._8_2_ = uVar130 >> uVar34;
      uVar131 = auVar57._10_2_;
      auVar125._10_2_ = uVar131 >> uVar34;
      uVar132 = auVar57._12_2_;
      uVar133 = auVar57._14_2_;
      auVar125._12_2_ = uVar132 >> uVar34;
      auVar125._14_2_ = uVar133 >> uVar34;
      auVar57 = psraw(auVar71,0xf);
      auVar71 = psubusw(auVar33,auVar102);
      auVar67 = psubusw(auVar33,auVar125);
      sVar56 = auVar71._0_2_;
      sVar60 = auVar71._2_2_;
      sVar61 = auVar71._4_2_;
      sVar62 = auVar71._6_2_;
      sVar63 = auVar71._8_2_;
      sVar64 = auVar71._10_2_;
      sVar65 = auVar71._12_2_;
      sVar66 = auVar71._14_2_;
      sVar37 = auVar67._0_2_;
      sVar43 = auVar67._2_2_;
      sVar45 = auVar67._4_2_;
      sVar47 = auVar67._6_2_;
      sVar49 = auVar67._8_2_;
      sVar51 = auVar67._10_2_;
      sVar53 = auVar67._12_2_;
      sVar55 = auVar67._14_2_;
      auVar74._0_2_ =
           (((short)uVar36 < sVar56) * uVar36 | (ushort)((short)uVar36 >= sVar56) * sVar56) +
           auVar38._0_2_;
      auVar74._2_2_ =
           (((short)uVar42 < sVar60) * uVar42 | (ushort)((short)uVar42 >= sVar60) * sVar60) +
           auVar38._2_2_;
      auVar74._4_2_ =
           (((short)uVar44 < sVar61) * uVar44 | (ushort)((short)uVar44 >= sVar61) * sVar61) +
           auVar38._4_2_;
      auVar74._6_2_ =
           (((short)uVar46 < sVar62) * uVar46 | (ushort)((short)uVar46 >= sVar62) * sVar62) +
           auVar38._6_2_;
      auVar74._8_2_ =
           (((short)uVar48 < sVar63) * uVar48 | (ushort)((short)uVar48 >= sVar63) * sVar63) +
           auVar38._8_2_;
      auVar74._10_2_ =
           (((short)uVar50 < sVar64) * uVar50 | (ushort)((short)uVar50 >= sVar64) * sVar64) +
           auVar38._10_2_;
      auVar74._12_2_ =
           (((short)uVar52 < sVar65) * uVar52 | (ushort)((short)uVar52 >= sVar65) * sVar65) +
           auVar38._12_2_;
      auVar74._14_2_ =
           (((short)uVar54 < sVar66) * uVar54 | (ushort)((short)uVar54 >= sVar66) * sVar66) +
           auVar38._14_2_;
      auVar122._0_2_ =
           (((short)uVar121 < sVar37) * uVar121 | (ushort)((short)uVar121 >= sVar37) * sVar37) +
           auVar57._0_2_;
      auVar122._2_2_ =
           (((short)uVar127 < sVar43) * uVar127 | (ushort)((short)uVar127 >= sVar43) * sVar43) +
           auVar57._2_2_;
      auVar122._4_2_ =
           (((short)uVar128 < sVar45) * uVar128 | (ushort)((short)uVar128 >= sVar45) * sVar45) +
           auVar57._4_2_;
      auVar122._6_2_ =
           (((short)uVar129 < sVar47) * uVar129 | (ushort)((short)uVar129 >= sVar47) * sVar47) +
           auVar57._6_2_;
      auVar122._8_2_ =
           (((short)uVar130 < sVar49) * uVar130 | (ushort)((short)uVar130 >= sVar49) * sVar49) +
           auVar57._8_2_;
      auVar122._10_2_ =
           (((short)uVar131 < sVar51) * uVar131 | (ushort)((short)uVar131 >= sVar51) * sVar51) +
           auVar57._10_2_;
      auVar122._12_2_ =
           (((short)uVar132 < sVar53) * uVar132 | (ushort)((short)uVar132 >= sVar53) * sVar53) +
           auVar57._12_2_;
      auVar122._14_2_ =
           (((short)uVar133 < sVar55) * uVar133 | (ushort)((short)uVar133 >= sVar55) * sVar55) +
           auVar57._14_2_;
      auVar74 = auVar74 ^ auVar38;
      auVar122 = auVar122 ^ auVar57;
      uVar2 = *(undefined8 *)(in + -lVar27);
      uVar3 = *(undefined8 *)(in + (0x90 - lVar27));
      uVar4 = *(undefined8 *)(in + (0x120 - lVar27));
      uVar5 = *(undefined8 *)(in + (0x1b0 - lVar27));
      auVar88._0_2_ = (short)uVar3 - sVar78;
      auVar88._2_2_ = (short)((ulong)uVar3 >> 0x10) - sVar94;
      auVar88._4_2_ = (short)((ulong)uVar3 >> 0x20) - sVar95;
      auVar88._6_2_ = (short)((ulong)uVar3 >> 0x30) - sVar96;
      auVar88._8_2_ = (short)uVar2 - sVar97;
      auVar88._10_2_ = (short)((ulong)uVar2 >> 0x10) - sVar98;
      auVar88._12_2_ = (short)((ulong)uVar2 >> 0x20) - sVar99;
      auVar88._14_2_ = (short)((ulong)uVar2 >> 0x30) - sVar100;
      auVar109._0_2_ = (short)uVar5 - sVar101;
      auVar109._2_2_ = (short)((ulong)uVar5 >> 0x10) - sVar114;
      auVar109._4_2_ = (short)((ulong)uVar5 >> 0x20) - sVar115;
      auVar109._6_2_ = (short)((ulong)uVar5 >> 0x30) - sVar116;
      auVar109._8_2_ = (short)uVar4 - sVar117;
      auVar109._10_2_ = (short)((ulong)uVar4 >> 0x10) - sVar118;
      auVar109._12_2_ = (short)((ulong)uVar4 >> 0x20) - sVar119;
      auVar109._14_2_ = (short)((ulong)uVar4 >> 0x30) - sVar120;
      auVar134 = pabsw(auVar125,auVar88);
      auVar71 = psraw(auVar88,0xf);
      uVar34 = (ulong)uVar29;
      uVar36 = auVar134._0_2_;
      auVar57._0_2_ = uVar36 >> uVar34;
      uVar42 = auVar134._2_2_;
      auVar57._2_2_ = uVar42 >> uVar34;
      uVar44 = auVar134._4_2_;
      auVar57._4_2_ = uVar44 >> uVar34;
      uVar46 = auVar134._6_2_;
      auVar57._6_2_ = uVar46 >> uVar34;
      uVar48 = auVar134._8_2_;
      auVar57._8_2_ = uVar48 >> uVar34;
      uVar50 = auVar134._10_2_;
      auVar57._10_2_ = uVar50 >> uVar34;
      uVar52 = auVar134._12_2_;
      uVar54 = auVar134._14_2_;
      auVar57._12_2_ = uVar52 >> uVar34;
      auVar57._14_2_ = uVar54 >> uVar34;
      auVar136 = pabsw(in_XMM12,auVar109);
      uVar121 = auVar136._0_2_;
      auVar140._0_2_ = uVar121 >> uVar34;
      uVar127 = auVar136._2_2_;
      auVar140._2_2_ = uVar127 >> uVar34;
      uVar128 = auVar136._4_2_;
      auVar140._4_2_ = uVar128 >> uVar34;
      uVar129 = auVar136._6_2_;
      auVar140._6_2_ = uVar129 >> uVar34;
      uVar130 = auVar136._8_2_;
      auVar140._8_2_ = uVar130 >> uVar34;
      uVar131 = auVar136._10_2_;
      auVar140._10_2_ = uVar131 >> uVar34;
      uVar132 = auVar136._12_2_;
      uVar133 = auVar136._14_2_;
      auVar140._12_2_ = uVar132 >> uVar34;
      auVar140._14_2_ = uVar133 >> uVar34;
      auVar102 = psraw(auVar109,0xf);
      auVar57 = psubusw(auVar33,auVar57);
      auVar38 = psubusw(auVar33,auVar140);
      sVar56 = auVar57._0_2_;
      sVar60 = auVar57._2_2_;
      sVar61 = auVar57._4_2_;
      sVar62 = auVar57._6_2_;
      sVar63 = auVar57._8_2_;
      sVar64 = auVar57._10_2_;
      sVar65 = auVar57._12_2_;
      sVar66 = auVar57._14_2_;
      sVar37 = auVar38._0_2_;
      sVar43 = auVar38._2_2_;
      sVar45 = auVar38._4_2_;
      sVar47 = auVar38._6_2_;
      sVar49 = auVar38._8_2_;
      sVar51 = auVar38._10_2_;
      sVar53 = auVar38._12_2_;
      sVar55 = auVar38._14_2_;
      auVar82._0_2_ =
           (((short)uVar36 < sVar56) * uVar36 | (ushort)((short)uVar36 >= sVar56) * sVar56) +
           auVar71._0_2_;
      auVar82._2_2_ =
           (((short)uVar42 < sVar60) * uVar42 | (ushort)((short)uVar42 >= sVar60) * sVar60) +
           auVar71._2_2_;
      auVar82._4_2_ =
           (((short)uVar44 < sVar61) * uVar44 | (ushort)((short)uVar44 >= sVar61) * sVar61) +
           auVar71._4_2_;
      auVar82._6_2_ =
           (((short)uVar46 < sVar62) * uVar46 | (ushort)((short)uVar46 >= sVar62) * sVar62) +
           auVar71._6_2_;
      auVar82._8_2_ =
           (((short)uVar48 < sVar63) * uVar48 | (ushort)((short)uVar48 >= sVar63) * sVar63) +
           auVar71._8_2_;
      auVar82._10_2_ =
           (((short)uVar50 < sVar64) * uVar50 | (ushort)((short)uVar50 >= sVar64) * sVar64) +
           auVar71._10_2_;
      auVar82._12_2_ =
           (((short)uVar52 < sVar65) * uVar52 | (ushort)((short)uVar52 >= sVar65) * sVar65) +
           auVar71._12_2_;
      auVar82._14_2_ =
           (((short)uVar54 < sVar66) * uVar54 | (ushort)((short)uVar54 >= sVar66) * sVar66) +
           auVar71._14_2_;
      auVar67._0_2_ =
           (((short)uVar121 < sVar37) * uVar121 | (ushort)((short)uVar121 >= sVar37) * sVar37) +
           auVar102._0_2_;
      auVar67._2_2_ =
           (((short)uVar127 < sVar43) * uVar127 | (ushort)((short)uVar127 >= sVar43) * sVar43) +
           auVar102._2_2_;
      auVar67._4_2_ =
           (((short)uVar128 < sVar45) * uVar128 | (ushort)((short)uVar128 >= sVar45) * sVar45) +
           auVar102._4_2_;
      auVar67._6_2_ =
           (((short)uVar129 < sVar47) * uVar129 | (ushort)((short)uVar129 >= sVar47) * sVar47) +
           auVar102._6_2_;
      auVar67._8_2_ =
           (((short)uVar130 < sVar49) * uVar130 | (ushort)((short)uVar130 >= sVar49) * sVar49) +
           auVar102._8_2_;
      auVar67._10_2_ =
           (((short)uVar131 < sVar51) * uVar131 | (ushort)((short)uVar131 >= sVar51) * sVar51) +
           auVar102._10_2_;
      auVar67._12_2_ =
           (((short)uVar132 < sVar53) * uVar132 | (ushort)((short)uVar132 >= sVar53) * sVar53) +
           auVar102._12_2_;
      auVar67._14_2_ =
           (((short)uVar133 < sVar55) * uVar133 | (ushort)((short)uVar133 >= sVar55) * sVar55) +
           auVar102._14_2_;
      auVar82 = auVar82 ^ auVar71;
      auVar67 = auVar67 ^ auVar102;
      auVar38 = pshuflw(ZEXT416((uint)cdef_pri_taps[bVar32][0]),
                        ZEXT416((uint)cdef_pri_taps[bVar32][0]),0);
      sVar37 = auVar38._0_2_;
      sVar45 = auVar38._2_2_;
      uVar2 = *(undefined8 *)(in + lVar28);
      uVar3 = *(undefined8 *)(in + lVar28 + 0x90);
      uVar4 = *(undefined8 *)(in + lVar28 + 0x120);
      uVar5 = *(undefined8 *)(in + lVar28 + 0x1b0);
      auVar89._0_2_ = (short)uVar3 - sVar78;
      auVar89._2_2_ = (short)((ulong)uVar3 >> 0x10) - sVar94;
      auVar89._4_2_ = (short)((ulong)uVar3 >> 0x20) - sVar95;
      auVar89._6_2_ = (short)((ulong)uVar3 >> 0x30) - sVar96;
      auVar89._8_2_ = (short)uVar2 - sVar97;
      auVar89._10_2_ = (short)((ulong)uVar2 >> 0x10) - sVar98;
      auVar89._12_2_ = (short)((ulong)uVar2 >> 0x20) - sVar99;
      auVar89._14_2_ = (short)((ulong)uVar2 >> 0x30) - sVar100;
      auVar110._0_2_ = (short)uVar5 - sVar101;
      auVar110._2_2_ = (short)((ulong)uVar5 >> 0x10) - sVar114;
      auVar110._4_2_ = (short)((ulong)uVar5 >> 0x20) - sVar115;
      auVar110._6_2_ = (short)((ulong)uVar5 >> 0x30) - sVar116;
      auVar110._8_2_ = (short)uVar4 - sVar117;
      auVar110._10_2_ = (short)((ulong)uVar4 >> 0x10) - sVar118;
      auVar110._12_2_ = (short)((ulong)uVar4 >> 0x20) - sVar119;
      auVar110._14_2_ = (short)((ulong)uVar4 >> 0x30) - sVar120;
      auVar38 = pabsw(auVar134,auVar89);
      auVar71 = psraw(auVar89,0xf);
      auVar57 = pabsw(auVar136,auVar110);
      uVar36 = auVar38._0_2_;
      auVar134._0_2_ = uVar36 >> uVar34;
      uVar42 = auVar38._2_2_;
      auVar134._2_2_ = uVar42 >> uVar34;
      uVar44 = auVar38._4_2_;
      auVar134._4_2_ = uVar44 >> uVar34;
      uVar46 = auVar38._6_2_;
      auVar134._6_2_ = uVar46 >> uVar34;
      uVar48 = auVar38._8_2_;
      auVar134._8_2_ = uVar48 >> uVar34;
      uVar50 = auVar38._10_2_;
      auVar134._10_2_ = uVar50 >> uVar34;
      uVar52 = auVar38._12_2_;
      uVar54 = auVar38._14_2_;
      auVar134._12_2_ = uVar52 >> uVar34;
      auVar134._14_2_ = uVar54 >> uVar34;
      auVar102 = psraw(auVar110,0xf);
      uVar121 = auVar57._0_2_;
      auVar141._0_2_ = uVar121 >> uVar34;
      uVar127 = auVar57._2_2_;
      auVar141._2_2_ = uVar127 >> uVar34;
      uVar128 = auVar57._4_2_;
      auVar141._4_2_ = uVar128 >> uVar34;
      uVar129 = auVar57._6_2_;
      auVar141._6_2_ = uVar129 >> uVar34;
      uVar130 = auVar57._8_2_;
      auVar141._8_2_ = uVar130 >> uVar34;
      uVar131 = auVar57._10_2_;
      auVar141._10_2_ = uVar131 >> uVar34;
      uVar132 = auVar57._12_2_;
      uVar133 = auVar57._14_2_;
      auVar141._12_2_ = uVar132 >> uVar34;
      auVar141._14_2_ = uVar133 >> uVar34;
      auVar57 = psubusw(auVar33,auVar134);
      auVar38 = psubusw(auVar33,auVar141);
      sVar61 = auVar57._0_2_;
      sVar62 = auVar57._2_2_;
      sVar63 = auVar57._4_2_;
      sVar64 = auVar57._6_2_;
      sVar65 = auVar57._8_2_;
      sVar66 = auVar57._10_2_;
      sVar76 = auVar57._12_2_;
      sVar77 = auVar57._14_2_;
      sVar43 = auVar38._0_2_;
      sVar47 = auVar38._2_2_;
      sVar49 = auVar38._4_2_;
      sVar51 = auVar38._6_2_;
      sVar53 = auVar38._8_2_;
      sVar55 = auVar38._10_2_;
      sVar56 = auVar38._12_2_;
      sVar60 = auVar38._14_2_;
      auVar75._0_2_ =
           (((short)uVar36 < sVar61) * uVar36 | (ushort)((short)uVar36 >= sVar61) * sVar61) +
           auVar71._0_2_;
      auVar75._2_2_ =
           (((short)uVar42 < sVar62) * uVar42 | (ushort)((short)uVar42 >= sVar62) * sVar62) +
           auVar71._2_2_;
      auVar75._4_2_ =
           (((short)uVar44 < sVar63) * uVar44 | (ushort)((short)uVar44 >= sVar63) * sVar63) +
           auVar71._4_2_;
      auVar75._6_2_ =
           (((short)uVar46 < sVar64) * uVar46 | (ushort)((short)uVar46 >= sVar64) * sVar64) +
           auVar71._6_2_;
      auVar75._8_2_ =
           (((short)uVar48 < sVar65) * uVar48 | (ushort)((short)uVar48 >= sVar65) * sVar65) +
           auVar71._8_2_;
      auVar75._10_2_ =
           (((short)uVar50 < sVar66) * uVar50 | (ushort)((short)uVar50 >= sVar66) * sVar66) +
           auVar71._10_2_;
      auVar75._12_2_ =
           (((short)uVar52 < sVar76) * uVar52 | (ushort)((short)uVar52 >= sVar76) * sVar76) +
           auVar71._12_2_;
      auVar75._14_2_ =
           (((short)uVar54 < sVar77) * uVar54 | (ushort)((short)uVar54 >= sVar77) * sVar77) +
           auVar71._14_2_;
      auVar136._0_2_ =
           (((short)uVar121 < sVar43) * uVar121 | (ushort)((short)uVar121 >= sVar43) * sVar43) +
           auVar102._0_2_;
      auVar136._2_2_ =
           (((short)uVar127 < sVar47) * uVar127 | (ushort)((short)uVar127 >= sVar47) * sVar47) +
           auVar102._2_2_;
      auVar136._4_2_ =
           (((short)uVar128 < sVar49) * uVar128 | (ushort)((short)uVar128 >= sVar49) * sVar49) +
           auVar102._4_2_;
      auVar136._6_2_ =
           (((short)uVar129 < sVar51) * uVar129 | (ushort)((short)uVar129 >= sVar51) * sVar51) +
           auVar102._6_2_;
      auVar136._8_2_ =
           (((short)uVar130 < sVar53) * uVar130 | (ushort)((short)uVar130 >= sVar53) * sVar53) +
           auVar102._8_2_;
      auVar136._10_2_ =
           (((short)uVar131 < sVar55) * uVar131 | (ushort)((short)uVar131 >= sVar55) * sVar55) +
           auVar102._10_2_;
      auVar136._12_2_ =
           (((short)uVar132 < sVar56) * uVar132 | (ushort)((short)uVar132 >= sVar56) * sVar56) +
           auVar102._12_2_;
      auVar136._14_2_ =
           (((short)uVar133 < sVar60) * uVar133 | (ushort)((short)uVar133 >= sVar60) * sVar60) +
           auVar102._14_2_;
      auVar75 = auVar75 ^ auVar71;
      auVar136 = auVar136 ^ auVar102;
      uVar2 = *(undefined8 *)(in + -lVar28);
      uVar3 = *(undefined8 *)(in + (0x90 - lVar28));
      uVar4 = *(undefined8 *)(in + (0x120 - lVar28));
      uVar5 = *(undefined8 *)(in + (0x1b0 - lVar28));
      auVar126._0_2_ = (short)uVar3 - sVar78;
      auVar126._2_2_ = (short)((ulong)uVar3 >> 0x10) - sVar94;
      auVar126._4_2_ = (short)((ulong)uVar3 >> 0x20) - sVar95;
      auVar126._6_2_ = (short)((ulong)uVar3 >> 0x30) - sVar96;
      auVar126._8_2_ = (short)uVar2 - sVar97;
      auVar126._10_2_ = (short)((ulong)uVar2 >> 0x10) - sVar98;
      auVar126._12_2_ = (short)((ulong)uVar2 >> 0x20) - sVar99;
      auVar126._14_2_ = (short)((ulong)uVar2 >> 0x30) - sVar100;
      auVar137._0_2_ = (short)uVar5 - sVar101;
      auVar137._2_2_ = (short)((ulong)uVar5 >> 0x10) - sVar114;
      auVar137._4_2_ = (short)((ulong)uVar5 >> 0x20) - sVar115;
      auVar137._6_2_ = (short)((ulong)uVar5 >> 0x30) - sVar116;
      auVar137._8_2_ = (short)uVar4 - sVar117;
      auVar137._10_2_ = (short)((ulong)uVar4 >> 0x10) - sVar118;
      auVar137._12_2_ = (short)((ulong)uVar4 >> 0x20) - sVar119;
      auVar137._14_2_ = (short)((ulong)uVar4 >> 0x30) - sVar120;
      auVar38 = pabsw(auVar141,auVar126);
      auVar71 = psraw(auVar126,0xf);
      in_XMM14 = pabsw(in_XMM14,auVar137);
      uVar34 = (ulong)uVar29;
      uVar36 = auVar38._0_2_;
      auVar90._0_2_ = uVar36 >> uVar34;
      uVar42 = auVar38._2_2_;
      auVar90._2_2_ = uVar42 >> uVar34;
      uVar44 = auVar38._4_2_;
      auVar90._4_2_ = uVar44 >> uVar34;
      uVar46 = auVar38._6_2_;
      auVar90._6_2_ = uVar46 >> uVar34;
      uVar48 = auVar38._8_2_;
      auVar90._8_2_ = uVar48 >> uVar34;
      uVar50 = auVar38._10_2_;
      auVar90._10_2_ = uVar50 >> uVar34;
      uVar52 = auVar38._12_2_;
      uVar54 = auVar38._14_2_;
      auVar90._12_2_ = uVar52 >> uVar34;
      auVar90._14_2_ = uVar54 >> uVar34;
      in_XMM12 = psraw(auVar137,0xf);
      uVar121 = in_XMM14._0_2_;
      auVar144._0_2_ = uVar121 >> uVar34;
      uVar127 = in_XMM14._2_2_;
      auVar144._2_2_ = uVar127 >> uVar34;
      uVar128 = in_XMM14._4_2_;
      auVar144._4_2_ = uVar128 >> uVar34;
      uVar129 = in_XMM14._6_2_;
      auVar144._6_2_ = uVar129 >> uVar34;
      uVar130 = in_XMM14._8_2_;
      auVar144._8_2_ = uVar130 >> uVar34;
      uVar131 = in_XMM14._10_2_;
      auVar144._10_2_ = uVar131 >> uVar34;
      uVar132 = in_XMM14._12_2_;
      uVar133 = in_XMM14._14_2_;
      auVar144._12_2_ = uVar132 >> uVar34;
      auVar144._14_2_ = uVar133 >> uVar34;
      auVar57 = psubusw(auVar33,auVar90);
      auVar38 = psubusw(auVar33,auVar144);
      sVar61 = auVar57._0_2_;
      sVar62 = auVar57._2_2_;
      sVar63 = auVar57._4_2_;
      sVar64 = auVar57._6_2_;
      sVar65 = auVar57._8_2_;
      sVar66 = auVar57._10_2_;
      sVar76 = auVar57._12_2_;
      sVar77 = auVar57._14_2_;
      sVar43 = auVar38._0_2_;
      sVar47 = auVar38._2_2_;
      sVar49 = auVar38._4_2_;
      sVar51 = auVar38._6_2_;
      sVar53 = auVar38._8_2_;
      sVar55 = auVar38._10_2_;
      sVar56 = auVar38._12_2_;
      sVar60 = auVar38._14_2_;
      auVar111._0_2_ =
           (((short)uVar36 < sVar61) * uVar36 | (ushort)((short)uVar36 >= sVar61) * sVar61) +
           auVar71._0_2_;
      auVar111._2_2_ =
           (((short)uVar42 < sVar62) * uVar42 | (ushort)((short)uVar42 >= sVar62) * sVar62) +
           auVar71._2_2_;
      auVar111._4_2_ =
           (((short)uVar44 < sVar63) * uVar44 | (ushort)((short)uVar44 >= sVar63) * sVar63) +
           auVar71._4_2_;
      auVar111._6_2_ =
           (((short)uVar46 < sVar64) * uVar46 | (ushort)((short)uVar46 >= sVar64) * sVar64) +
           auVar71._6_2_;
      auVar111._8_2_ =
           (((short)uVar48 < sVar65) * uVar48 | (ushort)((short)uVar48 >= sVar65) * sVar65) +
           auVar71._8_2_;
      auVar111._10_2_ =
           (((short)uVar50 < sVar66) * uVar50 | (ushort)((short)uVar50 >= sVar66) * sVar66) +
           auVar71._10_2_;
      auVar111._12_2_ =
           (((short)uVar52 < sVar76) * uVar52 | (ushort)((short)uVar52 >= sVar76) * sVar76) +
           auVar71._12_2_;
      auVar111._14_2_ =
           (((short)uVar54 < sVar77) * uVar54 | (ushort)((short)uVar54 >= sVar77) * sVar77) +
           auVar71._14_2_;
      auVar91._0_2_ =
           (((short)uVar121 < sVar43) * uVar121 | (ushort)((short)uVar121 >= sVar43) * sVar43) +
           in_XMM12._0_2_;
      auVar91._2_2_ =
           (((short)uVar127 < sVar47) * uVar127 | (ushort)((short)uVar127 >= sVar47) * sVar47) +
           in_XMM12._2_2_;
      auVar91._4_2_ =
           (((short)uVar128 < sVar49) * uVar128 | (ushort)((short)uVar128 >= sVar49) * sVar49) +
           in_XMM12._4_2_;
      auVar91._6_2_ =
           (((short)uVar129 < sVar51) * uVar129 | (ushort)((short)uVar129 >= sVar51) * sVar51) +
           in_XMM12._6_2_;
      auVar91._8_2_ =
           (((short)uVar130 < sVar53) * uVar130 | (ushort)((short)uVar130 >= sVar53) * sVar53) +
           in_XMM12._8_2_;
      auVar91._10_2_ =
           (((short)uVar131 < sVar55) * uVar131 | (ushort)((short)uVar131 >= sVar55) * sVar55) +
           in_XMM12._10_2_;
      auVar91._12_2_ =
           (((short)uVar132 < sVar56) * uVar132 | (ushort)((short)uVar132 >= sVar56) * sVar56) +
           in_XMM12._12_2_;
      auVar91._14_2_ =
           (((short)uVar133 < sVar60) * uVar133 | (ushort)((short)uVar133 >= sVar60) * sVar60) +
           in_XMM12._14_2_;
      auVar111 = auVar111 ^ auVar71;
      auVar91 = auVar91 ^ in_XMM12;
      auVar38 = pshuflw(ZEXT416((uint)cdef_pri_taps[bVar32][1]),
                        ZEXT416((uint)cdef_pri_taps[bVar32][1]),0);
      sVar43 = auVar38._0_2_;
      sVar47 = auVar38._2_2_;
      auVar112._0_2_ =
           (auVar111._0_2_ + auVar75._0_2_) * sVar43 + (auVar82._0_2_ + auVar74._0_2_) * sVar37;
      auVar112._2_2_ =
           (auVar111._2_2_ + auVar75._2_2_) * sVar47 + (auVar82._2_2_ + auVar74._2_2_) * sVar45;
      auVar112._4_2_ =
           (auVar111._4_2_ + auVar75._4_2_) * sVar43 + (auVar82._4_2_ + auVar74._4_2_) * sVar37;
      auVar112._6_2_ =
           (auVar111._6_2_ + auVar75._6_2_) * sVar47 + (auVar82._6_2_ + auVar74._6_2_) * sVar45;
      auVar112._8_2_ =
           (auVar111._8_2_ + auVar75._8_2_) * sVar43 + (auVar82._8_2_ + auVar74._8_2_) * sVar37;
      auVar112._10_2_ =
           (auVar111._10_2_ + auVar75._10_2_) * sVar47 + (auVar82._10_2_ + auVar74._10_2_) * sVar45;
      auVar112._12_2_ =
           (auVar111._12_2_ + auVar75._12_2_) * sVar43 + (auVar82._12_2_ + auVar74._12_2_) * sVar37;
      auVar112._14_2_ =
           (auVar111._14_2_ + auVar75._14_2_) * sVar47 + (auVar82._14_2_ + auVar74._14_2_) * sVar45;
      auVar92._0_2_ =
           (auVar91._0_2_ + auVar136._0_2_) * sVar43 + (auVar67._0_2_ + auVar122._0_2_) * sVar37;
      auVar92._2_2_ =
           (auVar91._2_2_ + auVar136._2_2_) * sVar47 + (auVar67._2_2_ + auVar122._2_2_) * sVar45;
      auVar92._4_2_ =
           (auVar91._4_2_ + auVar136._4_2_) * sVar43 + (auVar67._4_2_ + auVar122._4_2_) * sVar37;
      auVar92._6_2_ =
           (auVar91._6_2_ + auVar136._6_2_) * sVar47 + (auVar67._6_2_ + auVar122._6_2_) * sVar45;
      auVar92._8_2_ =
           (auVar91._8_2_ + auVar136._8_2_) * sVar43 + (auVar67._8_2_ + auVar122._8_2_) * sVar37;
      auVar92._10_2_ =
           (auVar91._10_2_ + auVar136._10_2_) * sVar47 + (auVar67._10_2_ + auVar122._10_2_) * sVar45
      ;
      auVar92._12_2_ =
           (auVar91._12_2_ + auVar136._12_2_) * sVar43 + (auVar67._12_2_ + auVar122._12_2_) * sVar37
      ;
      auVar92._14_2_ =
           (auVar91._14_2_ + auVar136._14_2_) * sVar47 + (auVar67._14_2_ + auVar122._14_2_) * sVar45
      ;
      auVar38 = psraw(auVar112,0xf);
      auVar57 = psraw(auVar92,0xf);
      auVar113._0_2_ = auVar112._0_2_ + auVar35._0_2_ + auVar38._0_2_;
      auVar113._2_2_ = auVar112._2_2_ + auVar35._2_2_ + auVar38._2_2_;
      auVar113._4_2_ = auVar112._4_2_ + auVar35._4_2_ + auVar38._4_2_;
      auVar113._6_2_ = auVar112._6_2_ + auVar35._6_2_ + auVar38._6_2_;
      auVar113._8_2_ = auVar112._8_2_ + auVar35._8_2_ + auVar38._8_2_;
      auVar113._10_2_ = auVar112._10_2_ + auVar35._10_2_ + auVar38._10_2_;
      auVar113._12_2_ = auVar112._12_2_ + auVar35._12_2_ + auVar38._12_2_;
      auVar113._14_2_ = auVar112._14_2_ + auVar35._14_2_ + auVar38._14_2_;
      auVar93._0_2_ = auVar92._0_2_ + auVar35._0_2_ + auVar57._0_2_;
      auVar93._2_2_ = auVar92._2_2_ + auVar35._2_2_ + auVar57._2_2_;
      auVar93._4_2_ = auVar92._4_2_ + auVar35._4_2_ + auVar57._4_2_;
      auVar93._6_2_ = auVar92._6_2_ + auVar35._6_2_ + auVar57._6_2_;
      auVar93._8_2_ = auVar92._8_2_ + auVar35._8_2_ + auVar57._8_2_;
      auVar93._10_2_ = auVar92._10_2_ + auVar35._10_2_ + auVar57._10_2_;
      auVar93._12_2_ = auVar92._12_2_ + auVar35._12_2_ + auVar57._12_2_;
      auVar93._14_2_ = auVar92._14_2_ + auVar35._14_2_ + auVar57._14_2_;
      auVar57 = psraw(auVar113,4);
      auVar38 = psraw(auVar93,4);
      in_XMM10._0_2_ = auVar57._0_2_ + sVar78;
      in_XMM10._2_2_ = auVar57._2_2_ + sVar94;
      in_XMM10._4_2_ = auVar57._4_2_ + sVar95;
      in_XMM10._6_2_ = auVar57._6_2_ + sVar96;
      in_XMM10._8_2_ = auVar57._8_2_ + sVar97;
      in_XMM10._10_2_ = auVar57._10_2_ + sVar98;
      in_XMM10._12_2_ = auVar57._12_2_ + sVar99;
      in_XMM10._14_2_ = auVar57._14_2_ + sVar100;
      sVar101 = auVar38._0_2_ + sVar101;
      sVar114 = auVar38._2_2_ + sVar114;
      sVar115 = auVar38._4_2_ + sVar115;
      sVar116 = auVar38._6_2_ + sVar116;
      sVar117 = auVar38._8_2_ + sVar117;
      sVar118 = auVar38._10_2_ + sVar118;
      sVar119 = auVar38._12_2_ + sVar119;
      sVar120 = auVar38._14_2_ + sVar120;
      uVar79 = CONCAT13((0 < sVar116) * (sVar116 < 0x100) * (char)sVar116 - (0xff < sVar116),
                        CONCAT12((0 < sVar115) * (sVar115 < 0x100) * (char)sVar115 -
                                 (0xff < sVar115),
                                 CONCAT11((0 < sVar114) * (sVar114 < 0x100) * (char)sVar114 -
                                          (0xff < sVar114),
                                          (0 < sVar101) * (sVar101 < 0x100) * (char)sVar101 -
                                          (0xff < sVar101))));
      auVar80._0_8_ =
           CONCAT17((0 < sVar120) * (sVar120 < 0x100) * (char)sVar120 - (0xff < sVar120),
                    CONCAT16((0 < sVar119) * (sVar119 < 0x100) * (char)sVar119 - (0xff < sVar119),
                             CONCAT15((0 < sVar118) * (sVar118 < 0x100) * (char)sVar118 -
                                      (0xff < sVar118),
                                      CONCAT14((0 < sVar117) * (sVar117 < 0x100) * (char)sVar117 -
                                               (0xff < sVar117),uVar79))));
      auVar80[8] = (0 < in_XMM10._0_2_) * (in_XMM10._0_2_ < 0x100) * (char)in_XMM10._0_2_ -
                   (0xff < in_XMM10._0_2_);
      auVar80[9] = (0 < in_XMM10._2_2_) * (in_XMM10._2_2_ < 0x100) * (char)in_XMM10._2_2_ -
                   (0xff < in_XMM10._2_2_);
      auVar80[10] = (0 < in_XMM10._4_2_) * (in_XMM10._4_2_ < 0x100) * (char)in_XMM10._4_2_ -
                    (0xff < in_XMM10._4_2_);
      auVar80[0xb] = (0 < in_XMM10._6_2_) * (in_XMM10._6_2_ < 0x100) * (char)in_XMM10._6_2_ -
                     (0xff < in_XMM10._6_2_);
      in_XMM9[0xc] = (0 < in_XMM10._8_2_) * (in_XMM10._8_2_ < 0x100) * (char)in_XMM10._8_2_ -
                     (0xff < in_XMM10._8_2_);
      in_XMM9._0_12_ = auVar80;
      in_XMM9[0xd] = (0 < in_XMM10._10_2_) * (in_XMM10._10_2_ < 0x100) * (char)in_XMM10._10_2_ -
                     (0xff < in_XMM10._10_2_);
      in_XMM9[0xe] = (0 < in_XMM10._12_2_) * (in_XMM10._12_2_ < 0x100) * (char)in_XMM10._12_2_ -
                     (0xff < in_XMM10._12_2_);
      in_XMM9[0xf] = (0 < in_XMM10._14_2_) * (in_XMM10._14_2_ < 0x100) * (char)in_XMM10._14_2_ -
                     (0xff < in_XMM10._14_2_);
      *(int *)dest = in_XMM9._12_4_;
      *(int *)((long)dest + lVar30) = auVar80._8_4_;
      *(int *)((long)dest + lVar30 * 2) = (int)((ulong)auVar80._0_8_ >> 0x20);
      *(undefined4 *)((long)dest + lVar30 * 3) = uVar79;
      dest = (void *)((long)dest + lVar30 * 4);
      in = in + 0x240;
    }
  }
  return;
}

Assistant:

void SIMD_FUNC(cdef_filter_8_1)(void *dest, int dstride, const uint16_t *in,
                                int pri_strength, int sec_strength, int dir,
                                int pri_damping, int sec_damping,
                                int coeff_shift, int block_width,
                                int block_height) {
  if (block_width == 8) {
    filter_block_8x8(/*is_lowbd=*/1, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/1,
                     /*enable_secondary=*/0);
  } else {
    filter_block_4x4(/*is_lowbd=*/1, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/1,
                     /*enable_secondary=*/0);
  }
}